

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

void __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,size_type new_size)

{
  long lVar1;
  size_type sVar2;
  uint uVar3;
  size_t __len;
  uint uVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  uint uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = this->_size;
  uVar6 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar6 = uVar4;
  }
  if (new_size != uVar6) {
    if (new_size < uVar6) {
      sVar2 = uVar4 + (new_size - uVar6);
    }
    else {
      uVar3 = 0x1c;
      if (0x1c < uVar4) {
        uVar3 = (this->_union).indirect_contents.capacity;
      }
      if (uVar3 < new_size) {
        change_capacity(this,new_size);
      }
      uVar4 = new_size - uVar6;
      if (uVar4 != 0) {
        ppVar5 = this;
        if (0x1c < this->_size) {
          ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   (this->_union).indirect_contents.indirect;
        }
        memset((void *)((long)&ppVar5->_union + (long)(int)uVar6),0,(ulong)uVar4);
      }
      sVar2 = uVar4 + this->_size;
    }
    this->_size = sVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

bool is_direct() const { return _size <= N; }